

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lmq.c
# Opt level: O0

int nni_lmq_resize(nni_lmq *lmq,size_t cap)

{
  int iVar1;
  void *pvVar2;
  bool bVar3;
  nng_msg *local_40;
  size_t len;
  size_t alloc;
  nng_msg **new_q;
  nng_msg *msg;
  size_t cap_local;
  nni_lmq *lmq_local;
  
  for (len = 2; len < cap; len = len << 1) {
  }
  msg = (nng_msg *)cap;
  cap_local = (size_t)lmq;
  pvVar2 = nni_alloc(len << 3);
  if (pvVar2 == (void *)0x0) {
    lmq_local._4_4_ = 2;
  }
  else {
    local_40 = (nng_msg *)0x0;
    while( true ) {
      bVar3 = false;
      if (local_40 < msg) {
        iVar1 = nni_lmq_get((nni_lmq *)cap_local,(nng_msg **)&new_q);
        bVar3 = iVar1 == 0;
      }
      if (!bVar3) break;
      *(nng_msg ***)((long)pvVar2 + (long)local_40 * 8) = new_q;
      local_40 = (nng_msg *)((long)local_40->m_header_buf + 1);
    }
    nni_lmq_flush((nni_lmq *)cap_local);
    if (*(long *)(cap_local + 8) != 0) {
      nni_free(*(void **)(cap_local + 0x30),*(long *)(cap_local + 8) << 3);
    }
    *(void **)(cap_local + 0x30) = pvVar2;
    *(nng_msg **)cap_local = msg;
    *(size_t *)(cap_local + 8) = len;
    *(size_t *)(cap_local + 0x10) = len - 1;
    *(nng_msg **)(cap_local + 0x18) = local_40;
    *(nng_msg **)(cap_local + 0x28) = local_40;
    *(undefined8 *)(cap_local + 0x20) = 0;
    lmq_local._4_4_ = 0;
  }
  return lmq_local._4_4_;
}

Assistant:

int
nni_lmq_resize(nni_lmq *lmq, size_t cap)
{
	nng_msg  *msg;
	nng_msg **new_q;
	size_t    alloc;
	size_t    len;

	alloc = 2;
	while (alloc < cap) {
		alloc *= 2;
	}

	if ((new_q = nni_alloc(sizeof(nng_msg *) * alloc)) == NULL) {
		return (NNG_ENOMEM);
	}

	len = 0;
	while ((len < cap) && (nni_lmq_get(lmq, &msg) == 0)) {
		new_q[len++] = msg;
	}

	// Flush anything left over.
	nni_lmq_flush(lmq);

	if (lmq->lmq_alloc > 0) {
		nni_free(lmq->lmq_msgs, lmq->lmq_alloc * sizeof(nng_msg *));
	}
	lmq->lmq_msgs  = new_q;
	lmq->lmq_cap   = cap;
	lmq->lmq_alloc = alloc;
	lmq->lmq_mask  = alloc - 1;
	lmq->lmq_len   = len;
	lmq->lmq_put   = len;
	lmq->lmq_get   = 0;

	return (0);
}